

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierParser::addLeftParen(CQualifierParser *this)

{
  bool bVar1;
  allocator local_31;
  string local_30 [32];
  CQualifierParser *local_10;
  CQualifierParser *this_local;
  
  local_10 = this;
  bVar1 = CQualifierBuilder::IsNegative(&this->builder);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"unexpected left parenthesis in qualifier",&local_31);
    error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    CQualifierBuilder::AddNegative(&this->builder);
    this->afterRightParen = false;
  }
  return;
}

Assistant:

void CQualifierParser::addLeftParen()
{
	if( builder.IsNegative() ) {
		error( "unexpected left parenthesis in qualifier" );
	} else {
		builder.AddNegative();
		afterRightParen = false;
	}
}